

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::prepareSourceTexture
          (LineContinuationTest *this,texture *texture)

{
  pointer this_00;
  reference pvVar1;
  uint local_4c;
  GLuint pixel_offset;
  GLuint x;
  GLuint line_offset;
  GLuint y;
  GLuint i;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  texture *texture_local;
  LineContinuationTest *this_local;
  
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &texture->m_id;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0x1000);
  for (line_offset = 0; line_offset < 0x1000; line_offset = line_offset + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
                        (ulong)line_offset);
    *pvVar1 = 0xaaaaaaaa;
  }
  for (x = 0x10; x < 0x30; x = x + 1) {
    for (local_4c = 0x10; local_4c < 0x30; local_4c = local_4c + 1) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
                          (ulong)(local_4c + x * 0x40));
      *pvVar1 = 0xffff0000;
    }
  }
  Utils::texture::create
            ((texture *)
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x40,0x40,0x8058);
  this_00 = data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0);
  Utils::texture::update((texture *)this_00,0x40,0x40,0,0x1908,0x1401,pvVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return "uni_sampler";
}

Assistant:

const GLchar* LineContinuationTest::prepareSourceTexture(Utils::texture& texture)
{
	std::vector<GLuint> data;
	static const GLuint width	  = 64;
	static const GLuint height	 = 64;
	static const GLuint data_size  = width * height;
	static const GLuint blue_color = 0xffff0000;
	static const GLuint grey_color = 0xaaaaaaaa;

	data.resize(data_size);

	for (GLuint i = 0; i < data_size; ++i)
	{
		data[i] = grey_color;
	}

	for (GLuint y = 16; y < 48; ++y)
	{
		const GLuint line_offset = y * 64;

		for (GLuint x = 16; x < 48; ++x)
		{
			const GLuint pixel_offset = x + line_offset;

			data[pixel_offset] = blue_color;
		}
	}

	texture.create(width, height, GL_RGBA8);

	texture.update(width, height, 0 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

	return "uni_sampler";
}